

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

AuxArray<unsigned_int> * __thiscall
Js::FunctionBody::AllocateSlotIdInCachedScopeToNestedIndexArray(FunctionBody *this,uint32 slotCount)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this_00;
  undefined4 *puVar4;
  AuxArray<unsigned_int> *ptr;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&AuxArray<unsigned_int>::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab02c8;
  data.filename._0_4_ = 0x19d2;
  data.typeinfo = (type_info *)((ulong)slotCount * 4);
  this_00 = Memory::Recycler::TrackAllocInfo
                      (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                       recycler,(TrackAllocData *)local_58);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_0076e796;
    *puVar4 = 0;
  }
  ptr = (AuxArray<unsigned_int> *)
        Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                  (this_00,(size_t)((type_info *)((ulong)slotCount * 4) + 4));
  if (ptr == (AuxArray<unsigned_int> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_0076e796:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  ptr->count = slotCount;
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,SlotIdInCachedScopeToNestedIndexArray,ptr);
  return ptr;
}

Assistant:

Js::AuxArray<uint32> * FunctionBody::AllocateSlotIdInCachedScopeToNestedIndexArray(uint32 slotCount)
    {
        Js::AuxArray<uint32> * slotIdToNestedIndexArray = RecyclerNewPlusLeaf(GetScriptContext()->GetRecycler(), slotCount * sizeof(uint32), Js::AuxArray<uint32>, slotCount);
        SetSlotIdInCachedScopeToNestedIndexArray(slotIdToNestedIndexArray);
        return slotIdToNestedIndexArray;
    }